

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PcaModel.hpp
# Opt level: O0

VectorXf __thiscall
eos::morphablemodel::PcaModel::draw_sample
          (PcaModel *this,vector<float,_std::allocator<float>_> *coefficients)

{
  int iVar1;
  size_type sVar2;
  float *dataPtr;
  vector<float,_std::allocator<float>_> *in_RDX;
  Index extraout_RDX;
  VectorXf VVar3;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_90;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  local_70;
  undefined1 local_3b;
  Stride<0,_0> local_3a;
  undefined1 local_38 [8];
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> alphas;
  vector<float,_std::allocator<float>_> *coefficients_local;
  PcaModel *this_local;
  VectorXf *model_sample;
  
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDX);
  iVar1 = get_num_principal_components((PcaModel *)coefficients);
  if (sVar2 < (ulong)(long)iVar1) {
    iVar1 = get_num_principal_components((PcaModel *)coefficients);
    std::vector<float,_std::allocator<float>_>::resize(in_RDX,(long)iVar1);
  }
  dataPtr = std::vector<float,_std::allocator<float>_>::data(in_RDX);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDX);
  Eigen::Stride<0,_0>::Stride(&local_3a);
  Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_38,dataPtr
             ,sVar2,&local_3a);
  local_3b = 0;
  Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
            (&local_90,
             (MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)
             &coefficients[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_38);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
            (&local_70,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)coefficients,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)&local_90);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const>>
            ((Matrix<float,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
              *)&local_70);
  VVar3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)this;
  return (VectorXf)VVar3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXf draw_sample(std::vector<float> coefficients) const
    {
        // Fill the rest with zeros if not all coefficients are given:
        if (coefficients.size() < get_num_principal_components())
        {
            coefficients.resize(get_num_principal_components());
        }
        const Eigen::Map<Eigen::VectorXf> alphas(coefficients.data(), coefficients.size());

        const Eigen::VectorXf model_sample = mean + rescaled_pca_basis * alphas;

        return model_sample;
    }